

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
SetInstance::representation_abi_cxx11_(string *__return_storage_ptr__,SetInstance *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  string *psVar3;
  _Base_ptr p_Var4;
  long *plVar5;
  size_type *psVar6;
  _Self __tmp;
  string elements_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  p_Var4 = (this->_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->_value)._M_t._M_impl.super__Rb_tree_header;
  local_58 = __return_storage_ptr__;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      if (p_Var4 != (this->_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
        std::__cxx11::string::append((char *)&local_50);
      }
      (**(code **)(**(long **)(p_Var4 + 1) + 0x10))(&local_78);
      std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  std::operator+(&local_78,"{",&local_50);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
  psVar3 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar2 = plVar5[3];
    (local_58->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&local_58->field_2 + 8) = lVar2;
  }
  else {
    (local_58->_M_dataplus)._M_p = (pointer)*plVar5;
    (local_58->field_2)._M_allocated_capacity = *psVar6;
  }
  local_58->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return psVar3;
}

Assistant:

std::string SetInstance::representation() const {
    std::string elements_str;
    for (auto it = _value.begin(); it != _value.end(); it++) {
        if (it != _value.begin())
            elements_str += ",";
        elements_str += (*it)->representation();
    }
    return "{" + elements_str + "}";
}